

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall
QHttp2Stream::streamError(QHttp2Stream *this,Http2Error errorCode,QLatin1StringView message)

{
  uint uVar1;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar2;
  undefined8 uVar3;
  char *in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  Http2Error _t1;
  QHttp2Connection *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  long lVar4;
  char *in_stack_ffffffffffffff68;
  undefined1 local_88 [20];
  Http2Error in_stack_ffffffffffffff8c;
  QString local_60;
  char local_48 [32];
  char *local_28;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lVar4 = in_RDI;
  local_28 = in_RDX;
  qHttp2ConnectionLog();
  anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  while( true ) {
    bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar2) break;
    anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b2855);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff34,(char *)in_stack_ffffffffffffff28,(char *)0x2b286e);
    in_stack_ffffffffffffff40 = getConnection((QHttp2Stream *)0x2b2878);
    uVar1 = *(uint *)(in_RDI + 0x10);
    latin1.m_data = in_stack_ffffffffffffff68;
    latin1.m_size = lVar4;
    QString::QString((QString *)in_stack_ffffffffffffff40,latin1);
    QtPrivate::asString(&local_60);
    uVar3 = QString::utf16();
    QMessageLogger::debug
              (local_48,"[%p] stream %u finished with error: %ls (error code: %u)",
               in_stack_ffffffffffffff40,(ulong)uVar1,uVar3,(ulong)in_ESI);
    QString::~QString((QString *)0x2b28fd);
    local_10 = 0;
  }
  sendRST_STREAM((QHttp2Stream *)CONCAT44(in_ESI,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff8c);
  _t1 = (Http2Error)((ulong)local_88 >> 0x20);
  latin1_00.m_data = local_28;
  latin1_00.m_size = lVar4;
  QString::QString((QString *)in_stack_ffffffffffffff40,latin1_00);
  errorOccurred((QHttp2Stream *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),_t1,
                (QString *)in_stack_ffffffffffffff28);
  QString::~QString((QString *)0x2b2963);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::streamError(Http2::Http2Error errorCode,
                               QLatin1StringView message)
{
    qCDebug(qHttp2ConnectionLog, "[%p] stream %u finished with error: %ls (error code: %u)",
            getConnection(), m_streamID, qUtf16Printable(message), errorCode);

    sendRST_STREAM(errorCode);
    emit errorOccurred(errorCode, message);
}